

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty_printer.hpp
# Opt level: O0

void __thiscall
trial::protocol::json::example::pretty_printer::print_object_element(pretty_printer *this,int count)

{
  basic_writer<char,_16UL> *pbVar1;
  bool bVar2;
  value vVar3;
  error *peVar4;
  size_type sVar5;
  error_code eVar6;
  error_code ec;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  uint local_68;
  error_category *local_60;
  undefined1 local_58 [8];
  view_type key;
  int count_local;
  pretty_printer *this_local;
  
  vVar3 = basic_reader<char>::symbol(this->reader);
  if (vVar3 != key) {
    peVar4 = (error *)__cxa_allocate_exception(0x20);
    eVar6 = make_error_code(invalid_key);
    ec._M_cat = eVar6._M_cat;
    ec._4_4_ = 0;
    ec._M_value = eVar6._M_value;
    error::error(peVar4,ec);
    __cxa_throw(peVar4,&error::typeinfo,error::~error);
  }
  if (0 < count) {
    pbVar1 = this->writer;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&key._M_str,",");
    basic_writer<char,_16UL>::literal(pbVar1,(view_type *)&key._M_str);
    newline(this);
  }
  sVar5 = basic_reader<char>::level(this->reader);
  indent(this,(int)sVar5);
  _local_58 = basic_reader<char>::literal(this->reader);
  bVar2 = basic_reader<char>::next(this->reader);
  if (!bVar2) {
    peVar4 = (error *)__cxa_allocate_exception(0x20);
    eVar6 = make_error_code(invalid_value);
    local_68 = eVar6._M_value;
    eVar6._4_4_ = 0;
    eVar6._M_value = local_68;
    local_60 = eVar6._M_cat;
    error::error(peVar4,eVar6);
    __cxa_throw(peVar4,&error::typeinfo,error::~error);
  }
  basic_writer<char,_16UL>::literal(this->writer,(view_type *)local_58);
  pbVar1 = this->writer;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_78," : ");
  basic_writer<char,_16UL>::literal(pbVar1,&local_78);
  vVar3 = basic_reader<char>::symbol(this->reader);
  if (vVar3 == begin_array) {
    print_array(this,false);
  }
  else if (vVar3 == begin_object) {
    print_object(this,false);
  }
  else {
    print_value(this);
  }
  return;
}

Assistant:

void print_object_element(int count)
    {
        if (reader.symbol() != json::token::symbol::key)
            throw json::error(make_error_code(json::invalid_key));

        // Print value separator
        if (count > 0)
        {
            writer.literal(",");
            newline();
        }

        indent(reader.level());

        json::reader::view_type key = reader.literal();
        if (!reader.next())
            throw json::error(make_error_code(json::invalid_value));

        // Print key
        writer.literal(key);

        // Print key separator
        writer.literal(" : ");

        // Print value
        switch (reader.symbol())
        {
        case json::token::symbol::begin_array:
            print_array(false);
            break;

        case json::token::symbol::begin_object:
            print_object(false);
            break;

        default:
            print_value();
            break;
        }
    }